

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHTTP.cpp
# Opt level: O2

void __thiscall
adios2::transport::FileHTTP::Open
          (FileHTTP *this,string *name,Mode openMode,bool async,bool directio)

{
  ushort uVar1;
  in_addr_t iVar2;
  protoent *ppVar3;
  hostent *phVar4;
  char *__cp;
  allocator local_bc;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::_M_assign((string *)&(this->super_Transport).m_Name);
  ppVar3 = getprotobyname("tcp");
  if (ppVar3 == (protoent *)0x0) {
    std::__cxx11::string::string((string *)&local_58,"Toolkit",(allocator *)&local_38);
    std::__cxx11::string::string((string *)&local_78,"transport::file::FileHTTP",&local_bb);
    std::__cxx11::string::string((string *)&local_98,"Open",&local_bc);
    std::__cxx11::string::string((string *)&local_b8,"cannot make getprotobyname",&local_ba);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_58,&local_78,&local_98,&local_b8,-1);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  this->m_p_proto = ppVar3->p_proto;
  phVar4 = gethostbyname((this->m_hostname)._M_dataplus._M_p);
  if (phVar4 == (hostent *)0x0) {
    std::__cxx11::string::string((string *)&local_58,"Toolkit",(allocator *)&local_38);
    std::__cxx11::string::string((string *)&local_78,"transport::file::FileHTTP",&local_bb);
    std::__cxx11::string::string((string *)&local_98,"Open",&local_bc);
    std::operator+(&local_b8,"error: gethostbyname ",&this->m_hostname);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_58,&local_78,&local_98,&local_b8,-1);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  __cp = inet_ntoa((in_addr)*(in_addr_t *)*phVar4->h_addr_list);
  iVar2 = inet_addr(__cp);
  if (iVar2 == 0xffffffff) {
    std::__cxx11::string::string((string *)&local_58,"Toolkit",&local_bb);
    std::__cxx11::string::string((string *)&local_78,"transport::file::FileHTTP",&local_bc);
    std::__cxx11::string::string((string *)&local_98,"Open",&local_ba);
    std::__cxx11::string::string((string *)&local_38,*phVar4->h_addr_list,&local_b9);
    std::operator+(&local_b8,"error: inet_addr ",&local_38);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_58,&local_78,&local_98,&local_b8,-1);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  (this->sockaddr_in).sin_addr.s_addr = iVar2;
  (this->sockaddr_in).sin_family = 2;
  uVar1 = (ushort)this->m_server_port;
  (this->sockaddr_in).sin_port = uVar1 << 8 | uVar1 >> 8;
  return;
}

Assistant:

void FileHTTP::Open(const std::string &name, const Mode openMode, const bool async,
                    const bool directio)
{
    struct protoent *protoent;
    struct hostent *hostent;
    uint32_t addr_tmp;

    m_Name = name;
    /* Build the socket. */
    protoent = getprotobyname("tcp");
    if (protoent == NULL)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Open",
                                              "cannot make getprotobyname");
    }
    m_p_proto = protoent->p_proto;

    /* get from parameters. Where the proxy should run*/

    /* Build the address. */
#define _WINSOCK_DEPRECATED_NO_WARNINGS 1
    hostent = gethostbyname(m_hostname.c_str());
    if (hostent == NULL)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Open",
                                              "error: gethostbyname " + m_hostname);
    }
    addr_tmp = inet_addr(inet_ntoa(*(struct in_addr *)*(hostent->h_addr_list)));
    if (addr_tmp == INADDR_NONE)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileHTTP", "Open",
                                              "error: inet_addr " +
                                                  std::string(*(hostent->h_addr_list)));
    }
    sockaddr_in.sin_addr.s_addr = addr_tmp;
    sockaddr_in.sin_family = AF_INET;
    sockaddr_in.sin_port = htons(m_server_port);

    return;
}